

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> __thiscall
testing::Return<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>
          (testing *this,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *value)

{
  linked_ptr_internal extraout_RDX;
  ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> RVar1;
  _Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internal::ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>::
  ReturnAction((ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> *)this,
               (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_28);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base(&local_28);
  RVar1.value_.link_.next_ = extraout_RDX.next_;
  RVar1.value_.value_ = (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this;
  return (ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>)RVar1.value_;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(internal::move(value));
}